

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.cpp
# Opt level: O2

void __thiscall poly::poly(poly *this,size_t bits,istream *ss)

{
  size_t i;
  size_type __n;
  
  std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->x);
  std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->x,bits >> 5);
  for (__n = 0; bits >> 5 != __n; __n = __n + 1) {
    *(uint *)(ss + *(long *)(*(long *)ss + -0x18) + 0x18) =
         *(uint *)(ss + *(long *)(*(long *)ss + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->x,__n);
    std::istream::_M_extract<unsigned_int>((uint *)ss);
  }
  this->_degree = -1;
  return;
}

Assistant:

poly::poly(size_t bits, std::istream &ss) {
    x.resize(bits / 32);
    for (size_t i = 0; i < bits / 32; i++)
        ss >> std::hex >> x[i];
    _degree = -1;
}